

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O2

void __thiscall
FastPForLib::FastPForTest_fastpack_7_except_63_Test::~FastPForTest_fastpack_7_except_63_Test
          (FastPForTest_fastpack_7_except_63_Test *this)

{
  FastPForTest::~FastPForTest
            ((FastPForTest *)
             &this[-1].super_FastPForTest.out64.super__Vector_base<long,_std::allocator<long>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_7_except_63) {
    _genDataWithFixBits64(in64, 7, 256);
    std::vector<int64_t> excepts;
    _genDataWithFixBits64(excepts, 63, 6);
    in64[0] = excepts[0];
    in64[10] = excepts[1];
    in64[100] = excepts[2];
    in64[133] = excepts[3];
    in64[177] = excepts[4];
    in64[213] = excepts[5];
    _verify64();
  }